

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckType
          (SharedValidator *this,Location *loc,Type actual,Type expected,char *desc)

{
  char *pcVar1;
  char *loc_00;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  string local_90;
  string local_70;
  Type local_4c;
  Type local_44;
  Enum local_3c;
  char *local_38;
  char *desc_local;
  Location *loc_local;
  SharedValidator *this_local;
  Type expected_local;
  Type actual_local;
  
  local_4c = expected;
  local_44 = actual;
  local_38 = desc;
  desc_local = (char *)loc;
  loc_local = (Location *)this;
  unique0x1000015b = expected;
  expected_local = actual;
  local_3c = (Enum)TypeChecker::CheckType(actual,expected);
  bVar2 = Failed((Result)local_3c);
  loc_00 = desc_local;
  pcVar1 = local_38;
  if (bVar2) {
    Type::GetName_abi_cxx11_(&local_70,&expected_local);
    uVar3 = std::__cxx11::string::c_str();
    Type::GetName_abi_cxx11_(&local_90,(Type *)((long)&this_local + 4));
    uVar4 = std::__cxx11::string::c_str();
    PrintError(this,(Location *)loc_00,"type mismatch at %s. got %s, expected %s",pcVar1,uVar3,uVar4
              );
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    Result::Result((Result *)&actual_local,Error);
  }
  else {
    Result::Result((Result *)&actual_local,Ok);
  }
  return (Result)actual_local.enum_;
}

Assistant:

Result SharedValidator::CheckType(const Location& loc,
                                  Type actual,
                                  Type expected,
                                  const char* desc) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc, "type mismatch at %s. got %s, expected %s", desc,
               actual.GetName().c_str(), expected.GetName().c_str());
    return Result::Error;
  }
  return Result::Ok;
}